

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_nls_stg.c
# Opt level: O0

int cvNlsConvTestSensStg
              (SUNNonlinearSolver NLS,N_Vector ycorStg,N_Vector deltaStg,sunrealtype tol,
              N_Vector ewtStg,void *cvode_mem)

{
  int iVar1;
  undefined8 in_RDI;
  long in_R8;
  double in_XMM0_Qa;
  CVodeMem cv_mem_00;
  N_Vector *ewtS;
  N_Vector *deltaS;
  N_Vector *ycorS;
  sunrealtype dcon;
  sunrealtype Del;
  int retval;
  int m;
  CVodeMem cv_mem;
  N_Vector *in_stack_ffffffffffffff70;
  N_Vector *in_stack_ffffffffffffff78;
  N_Vector *xS;
  CVodeMem in_stack_ffffffffffffff80;
  double local_78;
  int local_44;
  long local_40;
  double local_28;
  undefined8 local_10;
  int local_4;
  
  if (in_R8 == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x13e,"cvNlsConvTestSensStg",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_stg.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    local_40 = in_R8;
    local_28 = in_XMM0_Qa;
    local_10 = in_RDI;
    cv_mem_00 = (CVodeMem)
                cvSensNorm(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffff70);
    iVar1 = SUNNonlinSolGetCurIter(local_10,&local_44);
    if (iVar1 == 0) {
      if (0 < local_44) {
        if (*(double *)(local_40 + 0x548) * 0.3 <= (double)cv_mem_00 / *(double *)(local_40 + 0x550)
           ) {
          local_78 = (double)cv_mem_00 / *(double *)(local_40 + 0x550);
        }
        else {
          local_78 = *(double *)(local_40 + 0x548) * 0.3;
        }
        *(double *)(local_40 + 0x548) = local_78;
      }
      if (*(double *)(local_40 + 0x548) <= 1.0) {
        xS = *(N_Vector **)(local_40 + 0x548);
      }
      else {
        xS = (N_Vector *)0x3ff0000000000000;
      }
      if (1.0 < ((double)cv_mem_00 * (double)xS) / local_28) {
        if ((local_44 < 1) || ((double)cv_mem_00 <= *(double *)(local_40 + 0x550) * 2.0)) {
          *(CVodeMem *)(local_40 + 0x550) = cv_mem_00;
          local_4 = 0x385;
        }
        else {
          local_4 = 0x386;
        }
      }
      else {
        if (*(int *)(local_40 + 0xe0) != 0) {
          if (local_44 != 0) {
            cv_mem_00 = (CVodeMem)cvSensNorm(cv_mem_00,xS,in_stack_ffffffffffffff70);
          }
          *(CVodeMem *)(local_40 + 0x570) = cv_mem_00;
          *(undefined4 *)(local_40 + 0x578) = 1;
        }
        local_4 = 0;
      }
    }
    else {
      local_4 = -0x15;
    }
  }
  return local_4;
}

Assistant:

static int cvNlsConvTestSensStg(SUNNonlinearSolver NLS, N_Vector ycorStg,
                                N_Vector deltaStg, sunrealtype tol,
                                N_Vector ewtStg, void* cvode_mem)
{
  CVodeMem cv_mem;
  int m, retval;
  sunrealtype Del;
  sunrealtype dcon;
  N_Vector *ycorS, *deltaS, *ewtS;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* extract the current sensitivity corrections */
  ycorS = NV_VECS_SW(ycorStg);

  /* extract the sensitivity deltas */
  deltaS = NV_VECS_SW(deltaStg);

  /* extract the sensitivity error weights */
  ewtS = NV_VECS_SW(ewtStg);

  /* compute the norm of the state and sensitivity corrections */
  Del = cvSensNorm(cv_mem, deltaS, ewtS);

  /* get the current nonlinear solver iteration count */
  retval = SUNNonlinSolGetCurIter(NLS, &m);
  if (retval != CV_SUCCESS) { return (CV_MEM_NULL); }

  /* Test for convergence. If m > 0, an estimate of the convergence
     rate constant is stored in crate, and used in the test.

     Recall that, even when errconS=SUNFALSE, all variables are used in the
     convergence test. Hence, we use Del (and not del). However, acnrm is used
     in the error test and thus it has different forms depending on errconS
     (and this explains why we have to carry around del and delS).
  */
  if (m > 0)
  {
    cv_mem->cv_crateS = SUNMAX(CRDOWN * cv_mem->cv_crateS, Del / cv_mem->cv_delp);
  }
  dcon = Del * SUNMIN(ONE, cv_mem->cv_crateS) / tol;

  /* check if nonlinear system was solved successfully */
  if (dcon <= ONE)
  {
    if (cv_mem->cv_errconS)
    {
      cv_mem->cv_acnrmS    = (m == 0) ? Del : cvSensNorm(cv_mem, ycorS, ewtS);
      cv_mem->cv_acnrmScur = SUNTRUE;
    }
    return (CV_SUCCESS);
  }

  /* check if the iteration seems to be diverging */
  if ((m >= 1) && (Del > RDIV * cv_mem->cv_delp))
  {
    return (SUN_NLS_CONV_RECVR);
  }

  /* Save norm of correction and loop again */
  cv_mem->cv_delp = Del;

  /* Not yet converged */
  return (SUN_NLS_CONTINUE);
}